

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

u16string *
anon_unknown.dwarf_ec6a::codecvt_u32_to_u16(u16string *__return_storage_ptr__,u32string *u32)

{
  string u8;
  string local_30;
  
  codecvt_u32_to_u8(&local_30,u32);
  codecvt_u8_to_u16(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string codecvt_u32_to_u16(const u32string& u32)
{
    // As above, to avoid reinterpret_cast<> and trying to pretend that
    // a UTF-16 string is really a UTF-16 byte string, we do this in two steps
    const string u8 = codecvt_u32_to_u8(u32);
    return codecvt_u8_to_u16(u8);
}